

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryReplaceNode
          (DiskHandle *this,PathPtr path,WriteMode mode,Function<int_(kj::StringPtr)> *tryCreate)

{
  PathPtr finalName;
  DiskHandle *pDVar1;
  String *pSVar2;
  bool bVar3;
  WriteMode WVar4;
  int iVar5;
  size_t sVar6;
  Function<int_(kj::StringPtr)> *pFVar7;
  PathPtr PVar8;
  Fault local_140;
  Fault f_2;
  undefined1 auStack_130 [4];
  int error_1;
  String *local_128;
  int local_11c;
  undefined1 auStack_118 [4];
  int _kjSyscallError_1;
  ArrayPtr<const_char> local_108;
  Function<int_(kj::StringPtr)> local_f8;
  String *local_e8;
  String *pSStack_e0;
  undefined1 local_d8 [8];
  String tempPath;
  Fault f_1;
  undefined1 auStack_80 [4];
  int error;
  String *local_78;
  int local_6c;
  undefined1 local_68 [4];
  int _kjSyscallError;
  String filename;
  Fault local_40;
  Fault f;
  Function<int_(kj::StringPtr)> *tryCreate_local;
  WriteMode mode_local;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (DiskHandle *)path.parts.ptr;
  f.exception = (Exception *)tryCreate;
  sVar6 = PathPtr::size((PathPtr *)&this_local);
  if (sVar6 == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x3b2,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    path_local.parts.size_._7_1_ = 0;
    _::Debug::Fault::~Fault(&local_40);
    goto LAB_00379233;
  }
  PathPtr::toString((String *)local_68,(PathPtr *)&this_local,false);
  bVar3 = has<kj::WriteMode,void>(mode,CREATE);
  if (bVar3) {
    local_78 = (String *)local_68;
    _auStack_80 = tryCreate;
    iVar5 = _::Debug::
            syscallError<kj::(anonymous_namespace)::DiskHandle::tryReplaceNode(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)const::_lambda()_1_>
                      ((anon_class_16_2_6d9a4a07 *)auStack_80,false);
    local_6c = iVar5;
    if (iVar5 == 0) {
      path_local.parts.size_._7_1_ = 1;
    }
    else {
      if (iVar5 == 2) {
        bVar3 = has<kj::WriteMode,void>(mode,CREATE_PARENT);
        if ((bVar3) && (sVar6 = PathPtr::size((PathPtr *)&this_local), sVar6 != 0)) {
          PVar8 = PathPtr::parent((PathPtr *)&this_local);
          WVar4 = operator|(CREATE,MODIFY);
          WVar4 = operator|(WVar4,CREATE_PARENT);
          bVar3 = tryMkdir(this,PVar8,WVar4,true);
          pSVar2 = path_local.parts.ptr;
          pDVar1 = this_local;
          if (bVar3) {
            WVar4 = operator-(mode,CREATE_PARENT);
            pFVar7 = mv<kj::Function<int(kj::StringPtr)>>(tryCreate);
            Function<int_(kj::StringPtr)>::Function((Function<int_(kj::StringPtr)> *)&f_1,pFVar7);
            PVar8.parts.size_ = (size_t)pSVar2;
            PVar8.parts.ptr = (String *)pDVar1;
            path_local.parts.size_._7_1_ =
                 tryReplaceNode(this,PVar8,WVar4,(Function<int_(kj::StringPtr)> *)&f_1);
            Function<int_(kj::StringPtr)>::~Function((Function<int_(kj::StringPtr)> *)&f_1);
            goto LAB_0037921d;
          }
        }
      }
      else if (iVar5 == 0x11) {
        bVar3 = has<kj::WriteMode,void>(mode,MODIFY);
        if (bVar3) goto LAB_00378fe3;
        path_local.parts.size_._7_1_ = 0;
        goto LAB_0037921d;
      }
      _::Debug::Fault::Fault<int,kj::PathPtr&>
                ((Fault *)&tempPath.content.disposer,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x3cb,iVar5,"create(path)","path",(PathPtr *)&this_local);
      path_local.parts.size_._7_1_ = 0;
      _::Debug::Fault::~Fault((Fault *)&tempPath.content.disposer);
    }
  }
  else {
LAB_00378fe3:
    local_e8 = (String *)this_local;
    pSStack_e0 = path_local.parts.ptr;
    pFVar7 = mv<kj::Function<int(kj::StringPtr)>>(tryCreate);
    Function<int_(kj::StringPtr)>::Function(&local_f8,pFVar7);
    finalName.parts.size_ = (size_t)pSStack_e0;
    finalName.parts.ptr = local_e8;
    createNamedTemporary((String *)local_d8,this,finalName,mode,&local_f8);
    Function<int_(kj::StringPtr)>::~Function(&local_f8);
    StringPtr::StringPtr((StringPtr *)&local_108,(String *)local_68);
    iVar5 = OwnFd::operator_cast_to_int(&this->fd);
    StringPtr::StringPtr((StringPtr *)auStack_118,(String *)local_d8);
    bVar3 = tryCommitReplacement
                      (this,(StringPtr)local_108,iVar5,(StringPtr)_auStack_118,mode,(int *)0x0);
    if (bVar3) {
      path_local.parts.size_._7_1_ = 1;
    }
    else {
      local_128 = (String *)local_d8;
      _auStack_130 = this;
      local_11c = _::Debug::
                  syscallError<kj::(anonymous_namespace)::DiskHandle::tryReplaceNode(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)const::_lambda()_2_>
                            ((anon_class_16_2_e4133854 *)auStack_130,false);
      if (local_11c != 0) {
        if (local_11c != 2) {
          f_2.exception._4_4_ = local_11c;
          _::Debug::Fault::Fault<int,kj::String&>
                    (&local_140,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x3de,local_11c,"unlinkat(fd, tempPath, 0)","tempPath",(String *)local_d8);
          _::Debug::Fault::fatal(&local_140);
        }
        f_2.exception._4_4_ = 2;
      }
      path_local.parts.size_._7_1_ = 0;
    }
    String::~String((String *)local_d8);
  }
LAB_0037921d:
  String::~String((String *)local_68);
LAB_00379233:
  return (bool)(path_local.parts.size_._7_1_ & 1);
}

Assistant:

bool tryReplaceNode(PathPtr path, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Replaces the given path with an object created by calling tryCreate().
    //
    // tryCreate() must behave like a syscall which creates the node at the path passed to it,
    // returning a negative value on error. If the path passed to tryCreate already exists, it
    // MUST fail with EEXIST.
    //
    // When `mode` includes MODIFY, replaceNode() reacts to EEXIST by creating the node in a
    // temporary location and then rename()ing it into place.

    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { return false; }
    }

    auto filename = path.toString();

    if (has(mode, WriteMode::CREATE)) {
      // First try just creating the node in-place.
      KJ_SYSCALL_HANDLE_ERRORS(tryCreate(filename)) {
        case EEXIST:
          // Target exists.
          if (has(mode, WriteMode::MODIFY)) {
            // Fall back to MODIFY path, below.
            break;
          } else {
            return false;
          }
        case ENOENT:
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryReplaceNode(path, mode - WriteMode::CREATE_PARENT, kj::mv(tryCreate));
          }
          KJ_FALLTHROUGH;
        default:
          KJ_FAIL_SYSCALL("create(path)", error, path) { return false; }
      } else {
        // Success.
        return true;
      }
    }

    // Either we don't have CREATE mode or the target already exists. We need to perform a
    // replacement instead.

    auto tempPath = createNamedTemporary(path, mode, kj::mv(tryCreate));
    if (tryCommitReplacement(filename, fd, tempPath, mode)) {
      return true;
    } else {
      KJ_SYSCALL_HANDLE_ERRORS(unlinkat(fd, tempPath.cStr(), 0)) {
        case ENOENT:
          // meh
          break;
        default:
          KJ_FAIL_SYSCALL("unlinkat(fd, tempPath, 0)", error, tempPath);
      }
      return false;
    }
  }